

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_asformat.cpp
# Opt level: O1

int __thiscall
icu_63::number::impl::LocalizedNumberFormatterAsFormat::clone
          (LocalizedNumberFormatterAsFormat *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  Format *this_00;
  
  this_00 = (Format *)UMemory::operator_new((UMemory *)0x3f8,(size_t)__fn);
  if (this_00 == (Format *)0x0) {
    this_00 = (Format *)0x0;
  }
  else {
    Format::Format(this_00,&this->super_Format);
    (this_00->super_UObject)._vptr_UObject =
         (_func_int **)&PTR__LocalizedNumberFormatterAsFormat_003b70d8;
    LocalizedNumberFormatter::LocalizedNumberFormatter
              ((LocalizedNumberFormatter *)(this_00 + 1),&this->fFormatter);
    Locale::Locale((Locale *)(this_00[2].actualLocale + 0x80),&this->fLocale);
  }
  return (int)this_00;
}

Assistant:

Format* LocalizedNumberFormatterAsFormat::clone() const {
    return new LocalizedNumberFormatterAsFormat(*this);
}